

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O0

void __thiscall iDynTree::SolidShape::SolidShape(SolidShape *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR___cxa_pure_virtual_004fa588;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  *(undefined1 *)(in_RDI + 5) = 0;
  iDynTree::Transform::Identity();
  VectorFixSize<4U>::VectorFixSize((VectorFixSize<4U> *)(in_RDI + 0x12));
  *(undefined1 *)(in_RDI + 0x16) = 0;
  Material::Material((Material *)this);
  return;
}

Assistant:

SolidShape::SolidShape()
        : nameIsValid(false)
        , link_H_geometry(iDynTree::Transform::Identity())
        , m_isMaterialSet(false)
    {
    }